

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Phase45.cpp
# Opt level: O2

void __thiscall
qclab::qgates::Phase45<std::complex<float>_>::apply
          (Phase45<std::complex<float>_> *this,Op op,int nbQubits,
          vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *vector,int offset)

{
  int iVar1;
  anon_class_16_2_357f297d f;
  anon_class_16_2_357f297d local_30;
  
  iVar1 = (*(this->super_QGate1<std::complex<float>_>).super_QObject<std::complex<float>_>.
            _vptr_QObject[3])();
  local_30.vector =
       (vector->super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>).
       _M_impl.super__Vector_impl_data._M_start;
  if (op == ConjTrans) {
    local_30.lambda._M_value = 0xbf3504f33f3504f3;
  }
  else {
    local_30.lambda._M_value = 0x3f3504f33f3504f3;
  }
  apply2b<qclab::qgates::lambda_Phase45<std::complex<float>>(qclab::Op,std::complex<float>*)::_lambda(unsigned_long)_1_>
            (nbQubits,iVar1 + offset,&local_30);
  return;
}

Assistant:

void Phase45< T >::apply( Op op , const int nbQubits ,
                            std::vector< T >& vector ,
                            const int offset ) const {
    const int qubit = this->qubit() + offset ;
    auto f = lambda_Phase45( op , vector.data() ) ;
    apply2b( nbQubits , qubit , f ) ;
  }